

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall SharedLattice_Join_Test::TestBody(SharedLattice_Join_Test *this)

{
  undefined1 *this_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  Element EVar3;
  AssertHelper local_520;
  Message local_518;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_4e0;
  Message local_4d8;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__8;
  Element elem_8;
  AssertHelper local_4a0;
  Message local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__7;
  Element elem_7;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__6;
  Element elem_6;
  AssertHelper local_3a0;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__5;
  Element elem_5;
  AssertHelper local_320;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__4;
  Element elem_4;
  AssertHelper local_2a0;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__3;
  Element elem_3;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__2;
  Element elem_2;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  Element elem_1;
  AssertHelper local_120;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  Message local_d8 [3];
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  Element elem;
  int local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  Seq local_80;
  undefined1 auStack_78 [8];
  Element two;
  undefined1 auStack_50 [8];
  Element one;
  undefined1 auStack_30 [8];
  Element zero;
  SharedPath<wasm::analysis::Integer<unsigned_int>_> shared;
  SharedLattice_Join_Test *this_local;
  
  this_00 = &zero.field_0xc;
  ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::SharedPath
            ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00,
             (Integer<unsigned_int> *)((long)&zero.seq + 3));
  EVar3 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::getBottom
                    ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00);
  one._8_8_ = EVar3.val;
  zero.val._0_4_ = EVar3.seq;
  auStack_30 = (undefined1  [8])one._8_8_;
  EVar3 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::getBottom
                    ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00);
  auStack_50 = (undefined1  [8])EVar3.val;
  one.val._0_4_ = EVar3.seq;
  two._12_4_ = 1;
  ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join<int>
            ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00,(Element *)auStack_50,
             (int *)&two.field_0xc);
  EVar3 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::getBottom
                    ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)EVar3.val;
  local_80 = EVar3.seq;
  local_8c = 2;
  auStack_78 = (undefined1  [8])local_88;
  two.val._0_4_ = local_80;
  ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join<int>
            ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00,(Element *)auStack_78,
             &local_8c);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_30;
  local_b9 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                       ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)this_00,
                        (Element *)&gtest_ar_.message_,(Element *)auStack_30);
  local_b9 = !local_b9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_b8,
               (AssertionResult *)"shared.join(elem, zero)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x276,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_110,"elem","zero",(Element *)&gtest_ar_.message_,
             (Element *)auStack_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x277,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_30;
  local_149 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__1.message_,(Element *)auStack_50);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_148,
               (AssertionResult *)"shared.join(elem, one)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x27c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_190,"elem","one",(Element *)&gtest_ar__1.message_,
             (Element *)auStack_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x27d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_30;
  local_1c9 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__2.message_,(Element *)auStack_78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_1c8,
               (AssertionResult *)"shared.join(elem, two)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x282,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_210,"elem","two",(Element *)&gtest_ar__2.message_,
             (Element *)auStack_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x283,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_50;
  local_249 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__3.message_,(Element *)auStack_30);
  local_249 = !local_249;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_248,
               (AssertionResult *)"shared.join(elem, zero)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x288,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_290,"elem","one",(Element *)&gtest_ar__3.message_,
             (Element *)auStack_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x289,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_50;
  local_2c9 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__4.message_,(Element *)auStack_50);
  local_2c9 = !local_2c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_2c8,
               (AssertionResult *)"shared.join(elem, one)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x28e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_310,"elem","one",(Element *)&gtest_ar__4.message_,
             (Element *)auStack_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x28f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_50;
  local_349 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__5.message_,(Element *)auStack_78);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_348,
               (AssertionResult *)"shared.join(elem, two)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x294,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_390,"elem","two",(Element *)&gtest_ar__5.message_,
             (Element *)auStack_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x295,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a0,&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_78;
  local_3c9 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__6.message_,(Element *)auStack_30);
  local_3c9 = !local_3c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_3c8,
               (AssertionResult *)"shared.join(elem, zero)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x29a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_410,"elem","two",(Element *)&gtest_ar__6.message_,
             (Element *)auStack_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x29b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_78;
  local_449 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__7.message_,(Element *)auStack_50);
  local_449 = !local_449;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_448,
               (AssertionResult *)"shared.join(elem, one)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2a0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_490,"elem","two",(Element *)&gtest_ar__7.message_,
             (Element *)auStack_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2a1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_78;
  local_4c9 = ::wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::join
                        ((SharedPath<wasm::analysis::Integer<unsigned_int>_> *)&zero.field_0xc,
                         (Element *)&gtest_ar__8.message_,(Element *)auStack_78);
  local_4c9 = !local_4c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_4c8,
               (AssertionResult *)"shared.join(elem, two)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2a6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  testing::internal::EqHelper::
  Compare<wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_wasm::analysis::SharedPath<wasm::analysis::Integer<unsigned_int>_>::Element,_nullptr>
            ((EqHelper *)local_510,"elem","two",(Element *)&gtest_ar__8.message_,
             (Element *)auStack_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x2a7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_520,&local_518);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  return;
}

Assistant:

TEST(SharedLattice, Join) {
  analysis::SharedPath<analysis::UInt32> shared{analysis::UInt32{}};

  auto zero = shared.getBottom();

  auto one = shared.getBottom();
  shared.join(one, 1);

  auto two = shared.getBottom();
  shared.join(two, 2);

  {
    auto elem = zero;
    EXPECT_FALSE(shared.join(elem, zero));
    EXPECT_EQ(elem, zero);
  }

  {
    auto elem = zero;
    EXPECT_TRUE(shared.join(elem, one));
    EXPECT_EQ(elem, one);
  }

  {
    auto elem = zero;
    EXPECT_TRUE(shared.join(elem, two));
    EXPECT_EQ(elem, two);
  }

  {
    auto elem = one;
    EXPECT_FALSE(shared.join(elem, zero));
    EXPECT_EQ(elem, one);
  }

  {
    auto elem = one;
    EXPECT_FALSE(shared.join(elem, one));
    EXPECT_EQ(elem, one);
  }

  {
    auto elem = one;
    EXPECT_TRUE(shared.join(elem, two));
    EXPECT_EQ(elem, two);
  }

  {
    auto elem = two;
    EXPECT_FALSE(shared.join(elem, zero));
    EXPECT_EQ(elem, two);
  }

  {
    auto elem = two;
    EXPECT_FALSE(shared.join(elem, one));
    EXPECT_EQ(elem, two);
  }

  {
    auto elem = two;
    EXPECT_FALSE(shared.join(elem, two));
    EXPECT_EQ(elem, two);
  }
}